

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O3

void __thiscall FNodeBuilder::PrintSet(FNodeBuilder *this,int l,DWORD set)

{
  FPrivVert *pFVar1;
  FPrivSeg *pFVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  
  Printf(5,"set %d:\n",l);
  if (set != 0xffffffff) {
    pFVar2 = (this->Segs).Array;
    do {
      uVar3 = 0x3a;
      if (pFVar2[set].linedef == -1) {
        uVar3 = 0x2b;
      }
      lVar4 = (long)pFVar2[set].v1;
      pFVar1 = (this->Vertices).Array;
      lVar5 = (long)pFVar2[set].v2;
      Printf(5,"\t%u(%td)%c%d(%d,%d)-%d(%d,%d)\n",(ulong)set,
             ((long)pFVar2[set].frontsector - (long)sectors >> 3) * 0x4fcace213f2b3885,uVar3,lVar4,
             (ulong)(uint)(int)*(short *)((long)&pFVar1[lVar4].super_FSimpleVert.x + 2),
             (ulong)(uint)(int)*(short *)((long)&pFVar1[lVar4].super_FSimpleVert.y + 2),lVar5,
             (ulong)(uint)(int)*(short *)((long)&pFVar1[lVar5].super_FSimpleVert.x + 2),
             (ulong)(uint)(int)*(short *)((long)&pFVar1[lVar5].super_FSimpleVert.y + 2));
      pFVar2 = (this->Segs).Array;
      set = pFVar2[set].next;
    } while (set != 0xffffffff);
  }
  Printf(5,"*\n");
  return;
}

Assistant:

void FNodeBuilder::PrintSet (int l, DWORD set)
{
	Printf (PRINT_LOG, "set %d:\n", l);
	for (; set != DWORD_MAX; set = Segs[set].next)
	{
		Printf (PRINT_LOG, "\t%u(%td)%c%d(%d,%d)-%d(%d,%d)\n", set, Segs[set].frontsector-sectors,
			Segs[set].linedef == -1 ? '+' : ':',
			Segs[set].v1,
			Vertices[Segs[set].v1].x>>16, Vertices[Segs[set].v1].y>>16,
			Segs[set].v2,
			Vertices[Segs[set].v2].x>>16, Vertices[Segs[set].v2].y>>16);
	}
	Printf (PRINT_LOG, "*\n");
}